

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setTimeRange(QDateTimeEdit *this,QTime min,QTime max)

{
  long lVar1;
  char cVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QDateTime local_40 [8];
  QDateTime local_38 [8];
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_30 = max.mds;
  local_2c = min.mds;
  cVar2 = QTime::isValid();
  if (cVar2 != '\0') {
    cVar2 = QTime::isValid();
    if (cVar2 != '\0') {
      uVar3 = ::QVariant::toDate();
      lVar1 = lVar1 + 0x508;
      QDateTime::QDateTime(local_38,uVar3,local_2c,lVar1,1);
      uVar3 = ::QVariant::toDate();
      QDateTime::QDateTime(local_40,uVar3,local_30,lVar1,1);
      setDateTimeRange(this,local_38,local_40);
      QDateTime::~QDateTime(local_40);
      QDateTime::~QDateTime(local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setTimeRange(QTime min, QTime max)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && max.isValid()) {
        setDateTimeRange(d->dateTimeValue(d->minimum.toDate(), min),
                         d->dateTimeValue(d->maximum.toDate(), max));
    }
}